

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Medals.cpp
# Opt level: O2

void __thiscall
RenX_MedalsPlugin::RenX_OnJoin(RenX_MedalsPlugin *this,Server *server,PlayerInfo *player)

{
  ulong uVar1;
  Server *pSVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  Config *this_00;
  undefined8 uVar6;
  size_t sVar7;
  string_view in_key;
  allocator<char> local_71;
  PlayerInfo *local_70;
  Server *local_68;
  string tagged_msg;
  string_view msg;
  
  if ((((player->uuid)._M_string_length != 0) && (player->isBot == false)) &&
     (local_70 = player, local_68 = server, cVar3 = RenX::Server::isMatchInProgress(), cVar3 != '\0'
     )) {
    iVar4 = getWorth(local_70);
    this_00 = (Config *)
              Jupiter::Config::getSection
                        (&this->field_0x38,(this->firstSection)._M_string_length,
                         (this->firstSection)._M_dataplus._M_p);
    while (this_00 != (Config *)0x0) {
      in_key._M_str = "MaxRecs";
      in_key._M_len = 7;
      iVar5 = Jupiter::Config::get<int>(this_00,in_key,0x7fffffff);
      if (iVar4 <= iVar5) {
        uVar1 = *(ulong *)(this_00 + 0x40);
        if (uVar1 == 0) {
          return;
        }
        iVar4 = rand();
        string_printf_abi_cxx11_(&tagged_msg,"%u",(ulong)(long)iVar4 % uVar1 + 1);
        msg = (string_view)
              Jupiter::Config::get(this_00,tagged_msg._M_string_length,tagged_msg._M_dataplus._M_p);
        sVar7 = msg._M_len;
        std::__cxx11::string::~string((string *)&tagged_msg);
        if (sVar7 == 0) {
          return;
        }
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&tagged_msg,&msg,&local_71);
        RenX::sanitizeTags((string *)&tagged_msg);
        pSVar2 = local_68;
        RenX::processTags((string *)&tagged_msg,local_68,local_70,(PlayerInfo *)0x0,
                          (BuildingInfo *)0x0);
        RenX::Server::sendMessage(pSVar2,tagged_msg._M_string_length,tagged_msg._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&tagged_msg);
        return;
      }
      uVar6 = Jupiter::Config::get(this_00,0xb,"NextSection",0);
      this_00 = (Config *)Jupiter::Config::getSection(&this->field_0x38,uVar6);
    }
  }
  return;
}

Assistant:

void RenX_MedalsPlugin::RenX_OnJoin(RenX::Server &server, const RenX::PlayerInfo &player) {
	if (!player.uuid.empty() && player.isBot == false && server.isMatchInProgress()) {
		int worth = getWorth(player);
		Jupiter::Config *section = RenX_MedalsPlugin::config.getSection(RenX_MedalsPlugin::firstSection);
		if (section != nullptr) {
			while (section->get<int>("MaxRecs"sv, std::numeric_limits<int>::max()) < worth) {
				if ((section = RenX_MedalsPlugin::config.getSection(section->get("NextSection"sv))) == nullptr) {
					return; // No matching section found.
				}
			}

			size_t table_size = section->getTable().size();

			if (table_size != 0) {
				std::string_view msg = section->get(string_printf("%u", (rand() % table_size) + 1));

				if (!msg.empty()) {
					std::string tagged_msg = static_cast<std::string>(msg);
					RenX::sanitizeTags(tagged_msg);
					RenX::processTags(tagged_msg, &server, &player);
					server.sendMessage(tagged_msg);
				}
			}
		}
	}
}